

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O1

Result __thiscall wabt::WastParser::ParseRegisterCommand(WastParser *this,CommandPtr *out_command)

{
  Command *pCVar1;
  Result RVar2;
  Command *pCVar3;
  Enum EVar4;
  string text;
  Location loc;
  Var var;
  string local_128;
  Location local_108;
  Var local_e0;
  Location local_98;
  Var local_70;
  
  RVar2 = Expect(this,Lpar);
  EVar4 = Error;
  if (RVar2.enum_ != Error) {
    GetToken((Token *)&local_e0,this);
    local_108.field_1.field_1.offset = local_e0.loc.field_1.field_1.offset;
    local_108.field_1._8_8_ = local_e0.loc.field_1._8_8_;
    local_108.filename.data_ = local_e0.loc.filename.data_;
    local_108.filename.size_ = local_e0.loc.filename.size_;
    RVar2 = Expect(this,Register);
    EVar4 = Error;
    if (RVar2.enum_ != Error) {
      local_128._M_string_length = 0;
      local_128.field_2._M_local_buf[0] = '\0';
      local_98.field_1.field_0.line = 0;
      local_98.field_1._4_8_ = 0;
      local_98.filename.data_ = (char *)0x0;
      local_98.filename.size_._0_4_ = 0;
      local_98.filename.size_._4_4_ = 0;
      local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
      Var::Var(&local_e0,0xffffffff,&local_98);
      RVar2 = ParseQuotedText(this,&local_128);
      EVar4 = Error;
      if (RVar2.enum_ != Error) {
        Var::Var(&local_70,this->last_module_index_,&local_108);
        ParseVarOpt(this,&local_e0,&local_70);
        Var::~Var(&local_70);
        RVar2 = Expect(this,Rpar);
        if (RVar2.enum_ != Error) {
          pCVar3 = (Command *)operator_new(0x78);
          local_98.filename.data_ = local_128._M_dataplus._M_p;
          local_98.filename.size_._0_4_ = (undefined4)local_128._M_string_length;
          local_98.filename.size_._4_4_ = (undefined4)(local_128._M_string_length >> 0x20);
          pCVar3->type = Register;
          pCVar3->_vptr_Command = (_func_int **)&PTR__RegisterCommand_002cd840;
          string_view::operator_cast_to_string((string *)(pCVar3 + 1),&local_98.filename);
          Var::Var((Var *)(pCVar3 + 3),&local_e0);
          pCVar1 = (out_command->_M_t).
                   super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
                   super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
                   super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl;
          (out_command->_M_t).
          super___uniq_ptr_impl<wabt::Command,_std::default_delete<wabt::Command>_>._M_t.
          super__Tuple_impl<0UL,_wabt::Command_*,_std::default_delete<wabt::Command>_>.
          super__Head_base<0UL,_wabt::Command_*,_false>._M_head_impl = pCVar3;
          EVar4 = Ok;
          if (pCVar1 != (Command *)0x0) {
            (*pCVar1->_vptr_Command[1])();
            EVar4 = Ok;
          }
        }
      }
      Var::~Var(&local_e0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_dataplus._M_p != &local_128.field_2) {
        operator_delete(local_128._M_dataplus._M_p);
      }
    }
  }
  return (Result)EVar4;
}

Assistant:

Result WastParser::ParseRegisterCommand(CommandPtr* out_command) {
  WABT_TRACE(ParseRegisterCommand);
  EXPECT(Lpar);
  Location loc = GetLocation();
  EXPECT(Register);
  std::string text;
  Var var;
  CHECK_RESULT(ParseQuotedText(&text));
  ParseVarOpt(&var, Var(last_module_index_, loc));
  EXPECT(Rpar);
  out_command->reset(new RegisterCommand(text, var));
  return Result::Ok;
}